

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.cpp
# Opt level: O2

int mbedtls_rsa_rsassa_pkcs1_v15_verify
              (mbedtls_rsa_context *ctx,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,uchar *sig
              )

{
  size_t __size;
  int iVar1;
  int iVar2;
  uchar *output;
  uchar *dst;
  
  iVar1 = -0x4080;
  if (hashlen == 0 && md_alg == MBEDTLS_MD_NONE || hash != (uchar *)0x0) {
    __size = ctx->len;
    output = (uchar *)calloc(1,__size);
    if (output == (uchar *)0x0) {
      iVar1 = -0x10;
    }
    else {
      dst = (uchar *)calloc(1,__size);
      if (dst == (uchar *)0x0) {
        iVar1 = -0x10;
      }
      else {
        iVar1 = rsa_rsassa_pkcs1_v15_encode(md_alg,hashlen,hash,__size,dst);
        if ((iVar1 == 0) && (iVar1 = mbedtls_rsa_public(ctx,sig,output), iVar1 == 0)) {
          iVar2 = mbedtls_ct_memcmp(output,dst,__size);
          iVar1 = -0x4380;
          if (iVar2 == 0) {
            iVar1 = 0;
          }
        }
      }
      mbedtls_zeroize_and_free(output,__size);
      if (dst != (uchar *)0x0) {
        mbedtls_zeroize_and_free(dst,__size);
      }
    }
  }
  return iVar1;
}

Assistant:

int mbedtls_rsa_rsassa_pkcs1_v15_verify(mbedtls_rsa_context *ctx,
                                        mbedtls_md_type_t md_alg,
                                        unsigned int hashlen,
                                        const unsigned char *hash,
                                        const unsigned char *sig)
{
    int ret = 0;
    size_t sig_len;
    unsigned char *encoded = NULL, *encoded_expected = NULL;

    if ((md_alg != MBEDTLS_MD_NONE || hashlen != 0) && hash == NULL) {
        return MBEDTLS_ERR_RSA_BAD_INPUT_DATA;
    }

    sig_len = ctx->len;

    /*
     * Prepare expected PKCS1 v1.5 encoding of hash.
     */

    if ((encoded          = (unsigned char*) mbedtls_calloc(1, sig_len)) == NULL ||
        (encoded_expected = (unsigned char*) mbedtls_calloc(1, sig_len)) == NULL) {
        ret = MBEDTLS_ERR_MPI_ALLOC_FAILED;
        goto cleanup;
    }

    if ((ret = rsa_rsassa_pkcs1_v15_encode(md_alg, hashlen, hash, sig_len,
                                           encoded_expected)) != 0) {
        goto cleanup;
    }

    /*
     * Apply RSA primitive to get what should be PKCS1 encoded hash.
     */

    ret = mbedtls_rsa_public(ctx, sig, encoded);
    if (ret != 0) {
        goto cleanup;
    }

    /*
     * Compare
     */

    if ((ret = mbedtls_ct_memcmp(encoded, encoded_expected,
                                 sig_len)) != 0) {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto cleanup;
    }

cleanup:

    if (encoded != NULL) {
        mbedtls_zeroize_and_free(encoded, sig_len);
    }

    if (encoded_expected != NULL) {
        mbedtls_zeroize_and_free(encoded_expected, sig_len);
    }

    return ret;
}